

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cross_product.cpp
# Opt level: O2

unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> __thiscall
duckdb::PhysicalCrossProduct::GetOperatorState(PhysicalCrossProduct *this,ExecutionContext *context)

{
  _func_int **in_RAX;
  pointer pGVar1;
  _func_int **local_18;
  
  local_18 = in_RAX;
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                       *)(context + 3));
  make_uniq<duckdb::CrossProductOperatorState,duckdb::ColumnDataCollection&>
            ((duckdb *)&local_18,(ColumnDataCollection *)(pGVar1 + 1));
  (this->super_CachingPhysicalOperator).super_PhysicalOperator._vptr_PhysicalOperator = local_18;
  return (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)
         (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)this;
}

Assistant:

unique_ptr<OperatorState> PhysicalCrossProduct::GetOperatorState(ExecutionContext &context) const {
	auto &sink = sink_state->Cast<CrossProductGlobalState>();
	return make_uniq<CrossProductOperatorState>(sink.rhs_materialized);
}